

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

void __thiscall
despot::SemiChainBelief::SemiChainBelief
          (SemiChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions)

{
  pointer pvVar1;
  void *pvVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__SemiChainBelief_0010ea90;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->alpha_,(long)num_mdp_actions);
  if (0 < num_mdp_actions) {
    lVar5 = 0;
    do {
      puVar4 = (undefined8 *)operator_new(0x10);
      *puVar4 = 0x3ff0000000000000;
      puVar4[1] = 0x3ff0000000000000;
      pvVar1 = (this->alpha_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = *(void **)((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar5);
      lVar3 = *(long *)((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar5 + 0x10);
      *(undefined8 **)
       ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + lVar5) = puVar4;
      *(undefined8 **)
       ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + lVar5 + 8) = puVar4 + 2;
      *(undefined8 **)
       ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + lVar5 + 0x10) = puVar4 + 2;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,lVar3 - (long)pvVar2);
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uint)num_mdp_actions * 0x18 != lVar5);
  }
  return;
}

Assistant:

SemiChainBelief::SemiChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_actions);
	for (int a = 0; a < num_mdp_actions; a++) {
		alpha_[a] = vector<double>(2, 1.0);
	}
}